

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall
QDateTimeEditPrivate::editorCursorPositionChanged(QDateTimeEditPrivate *this,int oldpos,int newpos)

{
  undefined1 *puVar1;
  QLineEdit *this_00;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int sectionIndex;
  uint uVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QArrayData *local_88 [2];
  int local_78;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->super_QAbstractSpinBoxPrivate).field_0x3d0 & 8) == 0) &&
     (bVar4 = QAbstractSpinBoxPrivate::specialValue(&this->super_QAbstractSpinBoxPrivate), !bVar4))
  {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d._0_4_ = 0xaaaaaaaa;
    local_58.d.d._4_4_ = 0xaaaaaaaa;
    local_58.d.ptr._0_4_ = 0xaaaaaaaa;
    local_58.d.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (&local_58,this);
    updateCache(this,&(this->super_QAbstractSpinBoxPrivate).value,&local_58);
    bVar4 = QLineEdit::hasSelectedText((this->super_QAbstractSpinBoxPrivate).edit);
    puVar1 = &(this->super_QAbstractSpinBoxPrivate).field_0x3d0;
    *puVar1 = *puVar1 | 8;
    iVar5 = sectionAt(this,newpos);
    if ((iVar5 == -1) && (iVar5 = -1, 0 < newpos && oldpos <= newpos)) {
      iVar5 = sectionAt(this,newpos + -1);
    }
    iVar6 = QLineEdit::selectionStart((this->super_QAbstractSpinBoxPrivate).edit);
    sectionIndex = sectionAt(this,iVar6);
    iVar8 = (int)this;
    if (sectionIndex == -1) {
      uVar7 = 0;
    }
    else {
      uVar7 = QDateTimeParser::sectionSize(iVar8 + 0x3d8);
    }
    iVar9 = newpos;
    if (iVar5 == -1) {
      if (((int)uVar7 < 1) || (iVar5 = QDateTimeParser::sectionPos(iVar8 + 0x3d8), iVar6 != iVar5))
      {
        bVar3 = false;
        bVar10 = false;
      }
      else {
        QLineEdit::selectedText(&local_70,(this->super_QAbstractSpinBoxPrivate).edit);
        bVar10 = local_70.d.size == (ulong)uVar7;
        bVar3 = true;
      }
      if ((bVar3) && (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0)) {
        LOCK();
        ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (bVar10) {
        iVar9 = -1;
        iVar5 = sectionIndex;
        if (!bVar4) {
          setSelected(this,sectionIndex,true);
        }
      }
      else {
        iVar5 = closestSection(this,newpos,oldpos <= newpos);
        iVar6 = QDateTimeParser::sectionPos(iVar8 + 0x3d8);
        iVar9 = 0;
        if (newpos < oldpos) {
          iVar8 = QDateTimeParser::sectionSize(iVar8 + 0x3d8);
          iVar9 = 0;
          if (0 < iVar8) {
            iVar9 = iVar8;
          }
        }
        iVar9 = iVar9 + iVar6;
        if (!bVar4) {
          QLineEdit::setCursorPosition((this->super_QAbstractSpinBoxPrivate).edit,iVar9);
        }
      }
    }
    if (!bVar4 && *(int *)&this->field_0x3e0 != iVar5) {
      (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xd0))
                (this,0);
    }
    if (iVar9 == -1) {
      setSelected(this,iVar5,true);
    }
    else {
      bVar4 = QLineEdit::hasSelectedText((this->super_QAbstractSpinBoxPrivate).edit);
      if (!bVar4) {
        this_00 = (this->super_QAbstractSpinBoxPrivate).edit;
        if (oldpos < newpos) {
          (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110)
          )(local_88,this);
          QLineEdit::setCursorPosition(this_00,(iVar9 + local_78) - (int)local_58.d.size);
          if (local_88[0] != (QArrayData *)0x0) {
            LOCK();
            (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_88[0],2,0x10);
            }
          }
        }
        else {
          QLineEdit::setCursorPosition(this_00,iVar9);
        }
      }
    }
    *(int *)&this->field_0x3e0 = iVar5;
    puVar1 = &(this->super_QAbstractSpinBoxPrivate).field_0x3d0;
    *puVar1 = *puVar1 & 0xf7;
    piVar2 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,0x10)
        ;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::editorCursorPositionChanged(int oldpos, int newpos)
{
    if (ignoreCursorPositionChanged || specialValue())
        return;
    const QString oldText = displayText();
    updateCache(value, oldText);

    const bool allowChange = !edit->hasSelectedText();
    const bool forward = oldpos <= newpos;
    ignoreCursorPositionChanged = true;
    int s = sectionAt(newpos);
    if (s == NoSectionIndex && forward && newpos > 0) {
        s = sectionAt(newpos - 1);
    }

    int c = newpos;

    const int selstart = edit->selectionStart();
    const int selSection = sectionAt(selstart);
    const int l = selSection != -1 ? sectionSize(selSection) : 0;

    if (s == NoSectionIndex) {
        if (l > 0 && selstart == sectionPos(selSection) && edit->selectedText().size() == l) {
            s = selSection;
            if (allowChange)
                setSelected(selSection, true);
            c = -1;
        } else {
            int closest = closestSection(newpos, forward);
            c = sectionPos(closest) + (forward ? 0 : qMax<int>(0, sectionSize(closest)));

            if (allowChange) {
                edit->setCursorPosition(c);
                QDTEDEBUG << c;
            }
            s = closest;
        }
    }

    if (allowChange && currentSectionIndex != s) {
        interpret(EmitIfChanged);
    }
    if (c == -1) {
        setSelected(s, true);
    } else if (!edit->hasSelectedText()) {
        if (oldpos < newpos) {
            edit->setCursorPosition(displayText().size() - (oldText.size() - c));
        } else {
            edit->setCursorPosition(c);
        }
    }

    QDTEDEBUG << "currentSectionIndex is set to" << sectionNode(s).name()
              << oldpos << newpos
              << "was" << sectionNode(currentSectionIndex).name();

    currentSectionIndex = s;
    Q_ASSERT_X(currentSectionIndex < sectionNodes.size(),
               "QDateTimeEditPrivate::editorCursorPositionChanged()",
               qPrintable(QString::fromLatin1("Internal error (%1 %2)").
                          arg(currentSectionIndex).
                          arg(sectionNodes.size())));

    ignoreCursorPositionChanged = false;
}